

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O1

void LzmaDec_InitDicAndState(CLzmaDec *p,Bool_conflict initDic,Bool_conflict initState)

{
  p->remainLen = 0;
  p->needFlush = 1;
  p->tempBufSize = 0;
  if (initDic != 0) {
    p->processedPos = 0;
    p->checkDicSize = 0;
    p->needInitState = 1;
  }
  if (initState != 0) {
    p->needInitState = 1;
  }
  return;
}

Assistant:

void LzmaDec_InitDicAndState(CLzmaDec *p, Bool initDic, Bool initState)
{
  p->needFlush = 1;
  p->remainLen = 0;
  p->tempBufSize = 0;

  if (initDic)
  {
    p->processedPos = 0;
    p->checkDicSize = 0;
    p->needInitState = 1;
  }
  if (initState)
    p->needInitState = 1;
}